

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O0

void __thiscall tetgenmesh::bond(tetgenmesh *this,triface *t1,triface *t2)

{
  tetrahedron ppdVar1;
  triface *t2_local;
  triface *t1_local;
  tetgenmesh *this_local;
  
  ppdVar1 = encode2(this,t2->tet,bondtbl[t1->ver][t2->ver]);
  t1->tet[(int)(t1->ver & 3)] = ppdVar1;
  ppdVar1 = encode2(this,t1->tet,bondtbl[t2->ver][t1->ver]);
  t2->tet[(int)(t2->ver & 3)] = ppdVar1;
  return;
}

Assistant:

inline void tetgenmesh::bond(triface& t1, triface& t2) {
  t1.tet[t1.ver & 3] = encode2(t2.tet, bondtbl[t1.ver][t2.ver]);
  t2.tet[t2.ver & 3] = encode2(t1.tet, bondtbl[t2.ver][t1.ver]);
}